

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

optional<QDateTime> __thiscall QHttpHeaders::dateTimeValueAt(QHttpHeaders *this,qsizetype i)

{
  char cVar1;
  long in_RDX;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  QByteArrayView value;
  optional<QDateTime> oVar2;
  QDateTime dt;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  value.m_data = *(storage_type **)(*(long *)(*(long *)i + 0x10) + 0x30 + in_RDX * 0x38);
  value.m_size = (qsizetype)&local_20;
  QNetworkHeadersPrivate::fromHttpDate(value);
  cVar1 = QDateTime::isValid();
  if (cVar1 != '\0') {
    QDateTime::QDateTime((QDateTime *)this,(QDateTime *)&local_20);
  }
  *(bool *)&this[1].d.d.ptr = cVar1 != '\0';
  QDateTime::~QDateTime((QDateTime *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  oVar2.super__Optional_base<QDateTime,_false,_false>._M_payload.
  super__Optional_payload<QDateTime,_true,_false,_false>.super__Optional_payload_base<QDateTime>.
  _8_8_ = extraout_RDX;
  oVar2.super__Optional_base<QDateTime,_false,_false>._M_payload.
  super__Optional_payload<QDateTime,_true,_false,_false>.super__Optional_payload_base<QDateTime>.
  _M_payload = (_Storage<QDateTime,_false>)this;
  return (optional<QDateTime>)
         oVar2.super__Optional_base<QDateTime,_false,_false>._M_payload.
         super__Optional_payload<QDateTime,_true,_false,_false>.
         super__Optional_payload_base<QDateTime>;
}

Assistant:

std::optional<QDateTime> QHttpHeaders::dateTimeValueAt(qsizetype i) const
{
    verify(i);
    QDateTime dt = QNetworkHeadersPrivate::fromHttpDate(valueAt(i));
    return dt.isValid() ? std::make_optional(std::move(dt)) :
                          std::nullopt;
}